

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  significand_type sVar1;
  buffer<char> *this;
  type tVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 extraout_RDX;
  bool bVar5;
  decimal_fp<double> dVar6;
  fp fVar7;
  fp y;
  fp x;
  size_t local_1c0;
  size_t num_digits;
  char *local_1a8;
  fixed_handler handler;
  int max_double_digits;
  fp cached_pow;
  fp local_118;
  significand_type sStack_108;
  fp normalized;
  int cached_exp10;
  int min_exp;
  int exp;
  buffer_appender<char> local_e0;
  unsigned_long local_d8;
  decimal_fp<double> dec;
  buffer_appender<char> local_c0;
  decimal_fp<float> local_b4;
  decimal_fp<float> dec_1;
  char local_a3 [3];
  buffer<char> *pbStack_a0;
  bool fixed;
  buffer<char> *buf_local;
  double dStack_90;
  int precision_local;
  double value_local;
  float_specs specs_local;
  char digit_1;
  uint64_t remainder;
  anon_class_16_2_fdf32556 divmod_integral;
  uint32_t digit;
  result result;
  uint64_t fractional;
  undefined1 auStack_48 [4];
  uint32_t integral;
  fp one;
  uint64_t local_28;
  result local_c;
  
  pbStack_a0 = buf;
  buf_local._4_4_ = precision;
  dStack_90 = value;
  value_local = (double)specs;
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x980,"value is negative");
  }
  value_local._4_4_ = specs._4_4_;
  local_a3[2] = specs._4_1_ == '\x02';
  if (0.0 < value) {
    if ((value_local._4_4_ >> 0x13 & 1) == 0) {
      dec_1 = (decimal_fp<float>)specs;
      specs_local.precision = snprintf_float<double>(value,precision,specs,buf);
    }
    else if (precision < 0) {
      if ((value_local._4_4_ >> 0x12 & 1) == 0) {
        dVar6 = dragonbox::to_decimal<double>(value);
        local_d8 = dVar6.significand;
        dec.significand._0_4_ = dVar6.exponent;
        buffer_appender<char>::buffer_appender(&local_e0,pbStack_a0);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>(local_e0,local_d8);
        specs_local.precision = (int)dec.significand;
      }
      else {
        local_b4 = dragonbox::to_decimal<float>((float)value);
        buffer_appender<char>::buffer_appender(&local_c0,pbStack_a0);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                  (local_c0,local_b4.significand);
        specs_local.precision = local_b4.exponent;
      }
    }
    else {
      cached_exp10 = 0;
      normalized._12_4_ = 0;
      fp::fp<double>(&local_118,value);
      fVar7.f = (ulong)(uint)local_118.e;
      fVar7._8_8_ = extraout_RDX;
      fVar7 = normalize<0>((detail *)local_118.f,fVar7);
      sStack_108 = fVar7.f;
      normalized.f._0_4_ = fVar7.e;
      fVar7 = get_cached_power(-0x7c - (int)normalized.f,(int *)&normalized.field_0xc);
      x.e = (int)normalized.f;
      x.f = sStack_108;
      y._12_4_ = 0;
      y.f = SUB128(fVar7._0_12_,0);
      y.e = SUB124(fVar7._0_12_,8);
      x._12_4_ = 0;
      fVar7 = operator*(x,y);
      sStack_108 = fVar7.f;
      normalized.f._0_4_ = fVar7.e;
      handler.fixed = true;
      handler._21_3_ = 2;
      if (0x2ff < buf_local._4_4_) {
        buf_local._4_4_ = 0x2ff;
      }
      local_1a8 = buffer<char>::data(pbStack_a0);
      sVar1 = sStack_108;
      handler.buf._0_4_ = 0;
      handler.buf._4_4_ = buf_local._4_4_;
      handler.size = -normalized._12_4_;
      handler.precision._0_1_ = local_a3[2] & 1;
      local_28 = 1;
      one._8_8_ = &local_1a8;
      fp::fp((fp *)auStack_48,1L << (-(char)(int)normalized.f & 0x3fU),(int)normalized.f);
      uVar4 = sVar1 >> (-(char)(undefined4)one.f & 0x3fU);
      fractional._4_4_ = (uint32_t)uVar4;
      if (fractional._4_4_ == 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                    ,0x5ec,"");
      }
      if ((uVar4 & 0xffffffff) != sVar1 >> (-(char)(undefined4)one.f & 0x3fU)) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                    ,0x5ed,"");
      }
      _digit = sVar1 & _auStack_48 - 1;
      cached_exp10 = count_digits(fractional._4_4_);
      local_c = fixed_handler::on_start
                          ((fixed_handler *)one._8_8_,
                           *(long *)(basic_data<void>::powers_of_10_64 +
                                    (long)(cached_exp10 + -1) * 8) <<
                           (-(char)(undefined4)one.f & 0x3fU),sVar1 / 10,10,&cached_exp10);
      if (local_c == more) {
        do {
          divmod_integral.integral._4_4_ = 0;
          divmod_integral.integral._0_4_ = 0;
          remainder = (uint64_t)&divmod_integral.integral;
          divmod_integral.digit = (uint32_t *)((long)&fractional + 4);
          switch(cached_exp10) {
          case 1:
            divmod_integral.integral._0_4_ = fractional._4_4_;
            fractional._4_4_ = 0;
            break;
          case 2:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,10);
            break;
          case 3:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,100);
            break;
          case 4:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,1000);
            break;
          case 5:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,10000);
            break;
          case 6:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,100000);
            break;
          case 7:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,1000000);
            break;
          case 8:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,10000000);
            break;
          case 9:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,100000000);
            break;
          case 10:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,1000000000);
            break;
          default:
            assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                        ,0x61f,"invalid number of digits");
          }
          cached_exp10 = cached_exp10 + -1;
          local_c = fixed_handler::on_digit
                              ((fixed_handler *)one._8_8_,
                               (char)(uint32_t)divmod_integral.integral + '0',
                               *(long *)(basic_data<void>::powers_of_10_64 + (long)cached_exp10 * 8)
                               << (-(char)(undefined4)one.f & 0x3fU),
                               ((ulong)fractional._4_4_ << (-(char)(undefined4)one.f & 0x3fU)) +
                               _digit,1,cached_exp10,true);
          if (local_c != more) goto LAB_00500212;
        } while (0 < cached_exp10);
        do {
          divmod_integral.integral._4_4_ = 0;
          local_28 = local_28 * 10;
          specs_local._7_1_ = (char)(_digit * 10 >> (-(char)(undefined4)one.f & 0x3fU)) + '0';
          _digit = _auStack_48 - 1 & _digit * 10;
          cached_exp10 = cached_exp10 + -1;
          local_c = fixed_handler::on_digit
                              ((fixed_handler *)one._8_8_,specs_local._7_1_,_auStack_48,_digit,
                               local_28,cached_exp10,false);
        } while (local_c == more);
      }
LAB_00500212:
      this = pbStack_a0;
      divmod_integral.integral._4_4_ = local_c;
      if (local_c == error) {
        cached_exp10 = ((int)handler.buf - normalized._12_4_) + -1 + cached_exp10;
        fallback_format<double>
                  (dStack_90,handler.buf._4_4_,(bool)((byte)(value_local._4_4_ >> 0x12) & 1),
                   pbStack_a0,&cached_exp10);
      }
      else {
        cached_exp10 = handler.size + cached_exp10;
        tVar2 = to_unsigned<int>((int)handler.buf);
        buffer<char>::try_resize(this,(ulong)tVar2);
      }
      if (((local_a3[2] & 1U) == 0) && ((value_local._4_4_ >> 0x14 & 1) == 0)) {
        local_1c0 = buffer<char>::size(pbStack_a0);
        while( true ) {
          bVar5 = false;
          if (local_1c0 != 0) {
            pcVar3 = buffer<char>::operator[]<unsigned_long>(pbStack_a0,local_1c0 - 1);
            bVar5 = *pcVar3 == '0';
          }
          if (!bVar5) break;
          local_1c0 = local_1c0 - 1;
          cached_exp10 = cached_exp10 + 1;
        }
        buffer<char>::try_resize(pbStack_a0,local_1c0);
      }
      specs_local.precision = cached_exp10;
    }
  }
  else if ((precision < 1) || (!(bool)local_a3[2])) {
    local_a3[1] = 0x30;
    buffer<char>::push_back(buf,local_a3 + 1);
    specs_local.precision = 0;
  }
  else {
    tVar2 = to_unsigned<int>(precision);
    buffer<char>::try_resize(buf,(ulong)tVar2);
    pcVar3 = buffer<char>::data(pbStack_a0);
    local_a3[0] = '0';
    std::uninitialized_fill_n<char*,int,char>(pcVar3,buf_local._4_4_,local_a3);
    specs_local.precision = -buf_local._4_4_;
  }
  return specs_local.precision;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}